

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O3

void __thiscall
CRegexParser::build_interval
          (CRegexParser *this,re_machine *new_machine,re_machine *sub,int min_val,int max_val,
          int var_id,int shortest)

{
  re_tuple *prVar1;
  uchar *puVar2;
  re_state_id rVar3;
  re_state_id rVar4;
  
  rVar3 = alloc_state(this);
  new_machine->init = rVar3;
  rVar3 = alloc_state(this);
  new_machine->final = rVar3;
  rVar3 = alloc_state(this);
  alloc_state(this);
  if (shortest == 0) {
    if (rVar3 == -1) goto LAB_0027a28e;
    rVar4 = sub->init;
    prVar1 = this->tuple_arr_ + rVar3;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_LOOP_BRANCH;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar4;
    }
    else {
      prVar1->next_state_2 = rVar4;
    }
    rVar4 = new_machine->final;
  }
  else {
    if (rVar3 == -1) goto LAB_0027a28e;
    rVar4 = new_machine->final;
    prVar1 = this->tuple_arr_ + rVar3;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_LOOP_BRANCH;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar4;
    }
    else {
      prVar1->next_state_2 = rVar4;
    }
    rVar4 = sub->init;
  }
  prVar1 = this->tuple_arr_ + rVar3;
  if (prVar1->next_state_1 == -1) {
    prVar1->typ = RE_LOOP_BRANCH;
    (prVar1->info).ch = L'\0';
    prVar1->next_state_1 = rVar4;
  }
  else {
    prVar1->next_state_2 = rVar4;
  }
LAB_0027a28e:
  if ((long)sub->final != -1) {
    prVar1 = this->tuple_arr_ + sub->final;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_EPSILON;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar3;
    }
    else {
      prVar1->next_state_2 = rVar3;
    }
  }
  if ((long)new_machine->init != -1) {
    prVar1 = this->tuple_arr_ + new_machine->init;
    if (prVar1->next_state_1 == -1) {
      prVar1->typ = RE_ZERO_VAR;
      (prVar1->info).ch = L'\0';
      prVar1->next_state_1 = rVar3;
    }
    else {
      prVar1->next_state_2 = rVar3;
    }
  }
  this->tuple_arr_[new_machine->init].info.sub.minlen = var_id;
  this->tuple_arr_[rVar3].info.sub.minlen = var_id;
  this->tuple_arr_[rVar3].info.loop.loop_min = min_val;
  this->tuple_arr_[rVar3].info.loop.loop_max = max_val;
  if (shortest != 0) {
    puVar2 = &this->tuple_arr_[rVar3].flags;
    *puVar2 = *puVar2 | 0x10;
  }
  return;
}

Assistant:

void CRegexParser::build_interval(re_machine *new_machine,
                                  re_machine *sub, int min_val, int max_val,
                                  int var_id, int shortest)
{
    re_machine inner_machine;
    
    /* initialize the outer (new) machine */
    init_machine(new_machine);

    /* initialize the inner machine */
    init_machine(&inner_machine);

    /* 
     *   Set the loop transition into the submachine, and set the other to
     *   bypass the submachine.  If we have a 'shortest' modifier, take
     *   the bypass branch first, otherwise take the enter branch first. 
     */
    if (shortest)
    {
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
    }
    else
    {
        set_trans(inner_machine.init, sub->init, RE_LOOP_BRANCH, 0);
        set_trans(inner_machine.init, new_machine->final, RE_LOOP_BRANCH, 0);
    }

    /* 
     *   set the final transition of the submachine to come back to the
     *   loop branch point 
     */
    set_trans(sub->final, inner_machine.init, RE_EPSILON, 0);

    /* 
     *   set the outer machine to transition into the inner machine and
     *   zero the loop variable 
     */
    set_trans(new_machine->init, inner_machine.init, RE_ZERO_VAR, 0);

    /* set the variable ID in the ZERO_VAR node */
    tuple_arr_[new_machine->init].info.loop.loop_var = var_id;

    /* set up the loop parameters in the loop node */
    tuple_arr_[inner_machine.init].info.loop.loop_var = var_id;
    tuple_arr_[inner_machine.init].info.loop.loop_min = min_val;
    tuple_arr_[inner_machine.init].info.loop.loop_max = max_val;

    /* 
     *   if there's a 'shortest' modifier, note it in the loop node, so
     *   that we can take the bypass branch first whenever possible 
     */
    if (shortest)
        tuple_arr_[inner_machine.init].flags |= RE_STATE_SHORTEST;
}